

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.h
# Opt level: O0

void __thiscall
Ptex::v2_2::PtexReader::TiledFaceBase::TiledFaceBase
          (TiledFaceBase *this,PtexReader *reader,Res resArg,Res tileresArg)

{
  DataType DVar1;
  int iVar2;
  int iVar3;
  Res in_CX;
  PtexReader *in_RSI;
  undefined8 *in_RDI;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffc8;
  Res RVar4;
  undefined4 in_stack_ffffffffffffffd4;
  
  FaceData::FaceData((FaceData *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                     SUB42((uint)in_stack_ffffffffffffffb4 >> 0x10,0));
  *in_RDI = &PTR__TiledFaceBase_0340f468;
  in_RDI[2] = in_RSI;
  *(Res *)(in_RDI + 3) = in_CX;
  std::
  vector<Ptex::v2_2::PtexReader::FaceData_*,_std::allocator<Ptex::v2_2::PtexReader::FaceData_*>_>::
  vector((vector<Ptex::v2_2::PtexReader::FaceData_*,_std::allocator<Ptex::v2_2::PtexReader::FaceData_*>_>
          *)0x8334ab);
  DVar1 = datatype(in_RSI);
  *(DataType *)((long)in_RDI + 0x1c) = DVar1;
  iVar2 = nchannels(in_RSI);
  *(int *)(in_RDI + 4) = iVar2;
  iVar3 = DataSize(*(DataType *)((long)in_RDI + 0x1c));
  *(int *)(in_RDI + 6) = iVar3 * *(int *)(in_RDI + 4);
  RVar4 = in_CX;
  iVar3 = Res::ntilesu((Res *)(in_RDI + 1),in_CX);
  *(int *)((long)in_RDI + 0x24) = iVar3;
  iVar3 = Res::ntilesv((Res *)(in_RDI + 1),in_CX);
  *(int *)(in_RDI + 5) = iVar3;
  *(int *)((long)in_RDI + 0x2c) = *(int *)((long)in_RDI + 0x24) * *(int *)(in_RDI + 5);
  std::
  vector<Ptex::v2_2::PtexReader::FaceData_*,_std::allocator<Ptex::v2_2::PtexReader::FaceData_*>_>::
  resize((vector<Ptex::v2_2::PtexReader::FaceData_*,_std::allocator<Ptex::v2_2::PtexReader::FaceData_*>_>
          *)CONCAT44(in_stack_ffffffffffffffd4,CONCAT22(RVar4,in_CX)),
         CONCAT44(iVar2,in_stack_ffffffffffffffc8));
  return;
}

Assistant:

TiledFaceBase(PtexReader* reader, Res resArg, Res tileresArg)
            : FaceData(resArg),
              _reader(reader),
              _tileres(tileresArg)
        {
            _dt = reader->datatype();
            _nchan = reader->nchannels();
            _pixelsize = DataSize(_dt)*_nchan;
            _ntilesu = _res.ntilesu(tileresArg);
            _ntilesv = _res.ntilesv(tileresArg);
            _ntiles = _ntilesu*_ntilesv;
            _tiles.resize(_ntiles);
        }